

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O2

void __thiscall
TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test::
~TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test
          (TEST_UnitTestMacros_FailureWithSIGNED_BYTES_EQUAL_Test *this)

{
  TEST_GROUP_CppUTestGroupUnitTestMacros::~TEST_GROUP_CppUTestGroupUnitTestMacros
            (&this->super_TEST_GROUP_CppUTestGroupUnitTestMacros);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(UnitTestMacros, FailureWithSIGNED_BYTES_EQUAL)
{
    fixture.runTestWithMethod(failingTestMethodWithSIGNED_BYTES_EQUAL_);
#if CPPUTEST_CHAR_BIT == 16
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xffff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfffe)>");
#elif CPPUTEST_CHAR_BIT == 8
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("expected <-1 (0xff)>");
    CHECK_TEST_FAILS_PROPER_WITH_TEXT("but was  <-2 (0xfe)>");
#endif
}